

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::on_ip_change(session_impl *this,error_code *ec)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  pointer piVar4;
  reopen_network_flags_t local_6d [13];
  anon_class_8_1_8991fb9c local_60;
  function<void_(const_boost::system::error_code_&)> local_58;
  string local_38;
  error_code *local_18;
  error_code *ec_local;
  session_impl *this_local;
  
  local_18 = ec;
  ec_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    uVar2 = boost::system::error_code::value(local_18);
    boost::system::error_code::message_abi_cxx11_(&local_38,local_18);
    uVar3 = ::std::__cxx11::string::c_str();
    session_log(this,"received error on_ip_change: %d, %s",(ulong)uVar2,uVar3);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    session_log(this,"received ip change from internal ip_notifier");
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool(local_18);
  if (((!bVar1) && ((this->m_abort & 1U) == 0)) &&
     (bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_ip_notifier), bVar1))
  {
    piVar4 = ::std::
             unique_ptr<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
             ::operator->(&this->m_ip_notifier);
    local_60.this = this;
    ::std::function<void(boost::system::error_code_const&)>::
    function<libtorrent::aux::session_impl::on_ip_change(boost::system::error_code_const&)::__0,void>
              ((function<void(boost::system::error_code_const&)> *)&local_58,&local_60);
    (**piVar4->_vptr_ip_change_notifier)(piVar4,&local_58);
    ::std::function<void_(const_boost::system::error_code_&)>::~function(&local_58);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::reopen_network_flags_tag,_void>::
    bitfield_flag(local_6d);
    reopen_network_sockets(this,local_6d[0]);
  }
  return;
}

Assistant:

void session_impl::on_ip_change(error_code const& ec)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (!ec)
			session_log("received ip change from internal ip_notifier");
		else
			session_log("received error on_ip_change: %d, %s", ec.value(), ec.message().c_str());
#endif
		if (ec || m_abort || !m_ip_notifier) return;
		m_ip_notifier->async_wait([this] (error_code const& e)
			{ wrap(&session_impl::on_ip_change, e); });
		reopen_network_sockets({});
	}